

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send.cpp
# Opt level: O2

void __thiscall MxxComm_SendRecv1_Test::~MxxComm_SendRecv1_Test(MxxComm_SendRecv1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxComm, SendRecv1) {
    mxx::comm c;

    // send variable sized vector in cyclic order
    std::vector<int> x(c.rank() + 1);
    // receive from next
    mxx::future<std::vector<int>> fvec = c.irecv_vec<int>(((c.rank()+1) % c.size())+1,(c.rank() + 1) % c.size());
    // send to previous
    c.isend(x, (c.rank() + (c.size()-1)) % c.size());
    ASSERT_EQ((c.rank() + 1) % c.size() + 1u, fvec.get().size());

    // send a string message in cyclic order between all processes in the communicator
    mxx::future<std::string> fstr = c.irecv_str(12,(c.rank() + 1) % c.size());
    c.send("Hello World!", (c.rank()+c.size()-1) % c.size());
    std::string s = fstr.get();
    ASSERT_EQ(std::string("Hello World!"), s);

}